

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O2

Var Js::JavascriptRegExp::EntryGetterFlags(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  RecyclableObject *thisObj;
  TempArenaAllocatorObject *tempAllocator;
  ThreadConfiguration *pTVar5;
  char16 *content;
  JavascriptString *pJVar6;
  int in_stack_00000010;
  undefined1 local_78 [8];
  StringBuilder<Memory::ArenaAllocator> bs;
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x38f,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bb2046;
    *puVar4 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&bs.firstChunkLength,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x390,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00bb2046:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  thisObj = GetThisObject((Arguments *)&bs.firstChunkLength,L"RegExp.prototype.flags",pSVar1);
  tempAllocator = ScriptContext::GetTemporaryAllocator(pSVar1,L"JavascriptRegExp");
  local_78 = (undefined1  [8])&tempAllocator->allocator;
  bs.alloc = (ArenaAllocator *)0x0;
  bs.firstChunk = (Data *)0x0;
  bs.lastChunk = (Data *)0x0;
  bs.appendPtr = (char16 *)0x0;
  bs.count = 5;
  AppendFlagForFlagsProperty
            ((StringBuilder<Memory::ArenaAllocator> *)local_78,thisObj,0x1a0,L'g',pSVar1);
  AppendFlagForFlagsProperty
            ((StringBuilder<Memory::ArenaAllocator> *)local_78,thisObj,0x1a5,L'i',pSVar1);
  AppendFlagForFlagsProperty
            ((StringBuilder<Memory::ArenaAllocator> *)local_78,thisObj,0x1a3,L'm',pSVar1);
  pTVar5 = (pSVar1->config).threadConfig;
  if (pTVar5->m_ES6Unicode == true) {
    AppendFlagForFlagsProperty
              ((StringBuilder<Memory::ArenaAllocator> *)local_78,thisObj,0x1a6,L'u',pSVar1);
    pTVar5 = (pSVar1->config).threadConfig;
  }
  if (pTVar5->m_ES2018RegExDotAll == true) {
    AppendFlagForFlagsProperty
              ((StringBuilder<Memory::ArenaAllocator> *)local_78,thisObj,0x1a4,L's',pSVar1);
    pTVar5 = (pSVar1->config).threadConfig;
  }
  if (pTVar5->m_ES6RegExSticky == true) {
    AppendFlagForFlagsProperty
              ((StringBuilder<Memory::ArenaAllocator> *)local_78,thisObj,0x1a7,L'y',pSVar1);
  }
  content = StringBuilder<Memory::ArenaAllocator>::Detach
                      ((StringBuilder<Memory::ArenaAllocator> *)local_78);
  pJVar6 = JavascriptString::NewCopyBuffer(content,bs.appendPtr._4_4_,pSVar1);
  ScriptContext::ReleaseTemporaryAllocator(pSVar1,tempAllocator);
  return pJVar6;
}

Assistant:

Var JavascriptRegExp::EntryGetterFlags(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();

        RecyclableObject *thisObj = GetThisObject(args, _u("RegExp.prototype.flags"), scriptContext);
        Var flags;

        BEGIN_TEMP_ALLOCATOR(tempAlloc, scriptContext, _u("JavascriptRegExp"))
        {
            StringBuilder<ArenaAllocator> bs(tempAlloc, 5);

#define APPEND_FLAG(propertyId, flag) AppendFlagForFlagsProperty(&bs, thisObj, propertyId, flag, scriptContext)
            // If you change the order of the flags, don't forget to change it in GetOptions() and ToString() too.
            APPEND_FLAG(PropertyIds::global, _u('g'));
            APPEND_FLAG(PropertyIds::ignoreCase, _u('i'));
            APPEND_FLAG(PropertyIds::multiline, _u('m'));

            ScriptConfiguration const * scriptConfig = scriptContext->GetConfig();

            if (scriptConfig->IsES6UnicodeExtensionsEnabled())
            {
                APPEND_FLAG(PropertyIds::unicode, _u('u'));
            }

            if (scriptConfig->IsES2018RegExDotAllEnabled())
            {
                APPEND_FLAG(PropertyIds::dotAll, _u('s'));
            }

            if (scriptConfig->IsES6RegExStickyEnabled())
            {
                APPEND_FLAG(PropertyIds::sticky, _u('y'));
            }
#undef APPEND_FLAG

            flags = Js::JavascriptString::NewCopyBuffer(bs.Detach(), bs.Count(), scriptContext);
        }
        END_TEMP_ALLOCATOR(tempAlloc, scriptContext);

        return flags;
    }